

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void ixgbe_read_stats(ixy_device *ixy,device_stats *stats)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long in_RSI;
  long in_RDI;
  uint64_t tx_bytes;
  uint64_t rx_bytes;
  uint32_t tx_pkts;
  uint32_t rx_pkts;
  ixy_device *__mptr;
  ixgbe_device *dev;
  
  uVar1 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x4074);
  uVar2 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x4080);
  uVar3 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x4088);
  uVar4 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x408c);
  uVar5 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x4090);
  uVar6 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x4094);
  if (in_RSI != 0) {
    *(ulong *)(in_RSI + 8) = (ulong)uVar1 + *(long *)(in_RSI + 8);
    *(ulong *)(in_RSI + 0x10) = (ulong)uVar2 + *(long *)(in_RSI + 0x10);
    *(long *)(in_RSI + 0x18) = CONCAT44(uVar4,uVar3) + *(long *)(in_RSI + 0x18);
    *(long *)(in_RSI + 0x20) = CONCAT44(uVar6,uVar5) + *(long *)(in_RSI + 0x20);
  }
  return;
}

Assistant:

void ixgbe_read_stats(struct ixy_device* ixy, struct device_stats* stats) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);
	uint32_t rx_pkts = get_reg32(dev->addr, IXGBE_GPRC);
	uint32_t tx_pkts = get_reg32(dev->addr, IXGBE_GPTC);
	uint64_t rx_bytes = get_reg32(dev->addr, IXGBE_GORCL) + (((uint64_t) get_reg32(dev->addr, IXGBE_GORCH)) << 32);
	uint64_t tx_bytes = get_reg32(dev->addr, IXGBE_GOTCL) + (((uint64_t) get_reg32(dev->addr, IXGBE_GOTCH)) << 32);
	if (stats) {
		stats->rx_pkts += rx_pkts;
		stats->tx_pkts += tx_pkts;
		stats->rx_bytes += rx_bytes;
		stats->tx_bytes += tx_bytes;
	}
}